

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  long lVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  int iVar3;
  int extraout_EAX;
  ostream *poVar4;
  char *pcVar5;
  int extraout_EDX;
  param_type *in_RSI;
  void *pvVar6;
  ostream *in_RDI;
  int in_R8D;
  int in_R9D;
  fmtflags flags;
  
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  pcVar5 = *(char **)in_RDI;
  lVar1 = *(long *)(pcVar5 + -0x18);
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)(in_RDI + lVar1),_Var2);
  poVar4 = std::operator<<(in_RDI,'(');
  iVar3 = snedecor_f_dist<float>::param_type::n(in_RSI);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  pvVar6 = (void *)0x20;
  poVar4 = std::operator<<(poVar4,' ');
  snedecor_f_dist<float>::param_type::m(in_RSI,pvVar6,extraout_EDX,pcVar5,in_R8D,in_R9D);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,extraout_EAX);
  std::operator<<(poVar4,')');
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return (basic_ostream<char,_std::char_traits<char>_> *)in_RDI;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << P.n() << ' ' << P.m() << ')';
        out.flags(flags);
        return out;
      }